

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

object __thiscall
pybind11::detail::
object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::operator()
          (object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
           *this,object *args,handle *args_1)

{
  handle *in_RCX;
  object oStack_18;
  
  make_tuple<(pybind11::return_value_policy)1,pybind11::object&,pybind11::handle_const&>
            ((pybind11 *)&oStack_18,(object *)args_1,in_RCX);
  accessor<pybind11::detail::accessor_policies::str_attr>::ptr
            ((accessor<pybind11::detail::accessor_policies::str_attr> *)args);
  simple_collector<(pybind11::return_value_policy)1>::call
            ((simple_collector<(pybind11::return_value_policy)1> *)this,(PyObject *)&oStack_18);
  pybind11::object::~object(&oStack_18);
  return (object)(handle)this;
}

Assistant:

object object_api<Derived>::operator()(Args &&...args) const {
    return detail::collect_arguments<policy>(std::forward<Args>(args)...).call(derived().ptr());
}